

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::PFor::decodeArray(PFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint32_t *puVar1;
  uint32_t *in_00;
  ulong uVar2;
  ulong uVar3;
  size_t thisnvalue;
  size_t local_38;
  
  uVar2 = (ulong)*in;
  puVar1 = in + 1;
  *nvalue = uVar2;
  in_00 = puVar1;
  if (uVar2 != 0) {
    for (uVar3 = 0; local_38 = uVar2 - uVar3, uVar3 <= uVar2 && local_38 != 0;
        uVar3 = uVar3 + local_38) {
      in_00 = __decodeArray(this,in_00,(long)((long)puVar1 + (len * 4 - (long)in_00)) >> 2,out,
                            &local_38);
      out = out + local_38;
      uVar2 = *nvalue;
    }
    *nvalue = uVar3;
  }
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t len,
                              uint32_t *out, size_t &nvalue) {
    nvalue = *in++;
    if (nvalue == 0)
      return in;
#ifndef NDEBUG
    const uint32_t *const initin = in;
#endif
    const uint32_t *const finalin = in + len;
    size_t totalnvalue(0);
    while (totalnvalue < nvalue) {
      size_t thisnvalue = nvalue - totalnvalue;
#ifndef NDEBUG
      const uint32_t *const befin(in);
#endif
      assert(finalin <= len + in);
      in = __decodeArray(in, finalin - in, out, thisnvalue);
      assert(in > befin);
      assert(in <= finalin);
      out += thisnvalue;
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
    }
    assert(in <= len + initin);
    assert(in <= finalin);
    nvalue = totalnvalue;
    return in;
  }